

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_tri(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face_id;
  REF_INT nodes [4];
  int local_80;
  int local_7c;
  REF_INT new_tri;
  REF_INT tri;
  REF_DBL xyz [3];
  int local_58;
  REF_INT new_node;
  REF_INT node;
  REF_INT ixyz;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    ref_cell = *(REF_CELL *)&ref_node->blank;
    _ntri = fopen((char *)ref_grid,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x6f
             ,"ref_import_tri","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      iVar2 = __isoc99_fscanf(_ntri,"%d %d",&ixyz,&node);
      if (iVar2 == 2) {
        for (local_58 = 0; local_58 < ixyz; local_58 = local_58 + 1) {
          uVar1 = ref_node_add((REF_NODE)ref_cell,(long)local_58,(REF_INT *)((long)xyz + 0x14));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x74,"ref_import_tri",(ulong)uVar1,"new_node");
            return uVar1;
          }
          if (local_58 != xyz[2]._4_4_) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x75,"ref_import_tri","node index");
            return 1;
          }
        }
        uVar1 = ref_node_initialize_n_global((REF_NODE)ref_cell,(long)ixyz);
        if (uVar1 == 0) {
          for (local_58 = 0; local_58 < ixyz; local_58 = local_58 + 1) {
            iVar2 = __isoc99_fscanf(_ntri,"%lf %lf %lf",&new_tri,xyz,xyz + 1);
            if (iVar2 != 3) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x7b,"ref_import_tri","xyz");
              return 1;
            }
            for (new_node = 0; new_node < 3; new_node = new_node + 1) {
              *(undefined8 *)(ref_cell->c2n + (long)(new_node + local_58 * 0xf) * 2) =
                   *(undefined8 *)(&new_tri + (long)new_node * 2);
            }
          }
          file = (FILE *)ref_node->part;
          nodes[1] = -1;
          for (local_7c = 0; local_7c < node; local_7c = local_7c + 1) {
            for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
              iVar2 = __isoc99_fscanf(_ntri,"%d",&ref_private_macro_code_rss + local_58);
              if (iVar2 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x84,"ref_import_tri","tri");
                return 1;
              }
            }
            ref_private_macro_code_rss = ref_private_macro_code_rss + -1;
            face_id = face_id + -1;
            nodes[0] = nodes[0] + -1;
            uVar1 = ref_cell_add((REF_CELL)file,&ref_private_macro_code_rss,&local_80);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x88,"ref_import_tri",(ulong)uVar1,"new tri");
              return uVar1;
            }
            if (local_7c != local_80) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x89,"ref_import_tri","tri index");
              return 1;
            }
          }
          file = (FILE *)ref_node->part;
          for (local_7c = 0; local_7c < node; local_7c = local_7c + 1) {
            iVar2 = __isoc99_fscanf(_ntri,"%d",&ref_private_macro_code_rss_1);
            if (iVar2 != 1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x8e,"ref_import_tri","tri id");
              return 1;
            }
            *(REF_STATUS *)
             (file->_IO_buf_base + (long)(*(int *)&file->_IO_read_ptr * local_7c + 3) * 4) =
                 ref_private_macro_code_rss_1;
          }
          fclose(_ntri);
          ref_grid_ptr_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x78,"ref_import_tri",(ulong)uVar1,"init glob");
          ref_grid_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x71,"ref_import_tri","nnode ntri");
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x69,
           "ref_import_tri",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_tri(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri;
  REF_INT ixyz, node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[4];
  REF_INT face_id;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(2, fscanf(file, "%d %d", &nnode, &ntri), "nnode ntri");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  for (node = 0; node < nnode; node++) {
    RES(3, fscanf(file, "%lf %lf %lf", &(xyz[0]), &(xyz[1]), &(xyz[2])), "xyz");
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) = xyz[ixyz];
  }

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  fclose(file);

  return REF_SUCCESS;
}